

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_t __n;
  storage_type *psVar6;
  size_t sVar7;
  storage_type *psVar8;
  uchar *b;
  qsizetype qVar9;
  storage_type *psVar10;
  long lVar11;
  char *__s1;
  
  __s1 = needle.m_data;
  __n = needle.m_size;
  psVar10 = haystack.m_data;
  lVar11 = haystack.m_size;
  if (lVar11 == 0) {
    uVar4 = -(ulong)(__n != 0 || from != 0);
  }
  else if (__n == 1) {
    if (from < 0) {
      lVar5 = 0;
      if (0 < from + lVar11) {
        lVar5 = from + lVar11;
      }
    }
    else {
      lVar5 = lVar11 + -1;
      if (from <= lVar11 + -1) {
        lVar5 = from;
      }
    }
    if (psVar10 == (storage_type *)0x0) {
LAB_00155b8c:
      psVar6 = (storage_type *)0x0;
    }
    else {
      lVar11 = lVar5 + 1;
      psVar8 = psVar10 + lVar5 + 1;
      do {
        if (lVar11 == 0) goto LAB_00155b8c;
        psVar6 = psVar8 + -1;
        lVar11 = lVar11 + -1;
        pcVar1 = psVar8 + -1;
        psVar8 = psVar6;
      } while (*pcVar1 != *__s1);
    }
    uVar4 = -(ulong)(psVar6 == (storage_type *)0x0) | (long)psVar6 - (long)psVar10;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    if (from <= lVar11) {
      lVar11 = lVar11 - __n;
      qVar9 = from;
      if (lVar11 < from) {
        qVar9 = lVar11;
      }
      if (from < 0) {
        qVar9 = lVar11;
      }
      if (-1 < qVar9) {
        if ((long)__n < 1) {
          lVar11 = 0;
          lVar5 = 0;
        }
        else {
          lVar5 = 0;
          lVar11 = 0;
          sVar7 = __n;
          do {
            lVar11 = (long)__s1[sVar7 - 1] + lVar11 * 2;
            lVar5 = (long)psVar10[sVar7 + qVar9 + -1] + lVar5 * 2;
            sVar7 = sVar7 - 1;
          } while (sVar7 != 0);
        }
        lVar5 = lVar5 - psVar10[qVar9];
        do {
          lVar5 = psVar10[qVar9] + lVar5;
          if ((lVar5 == lVar11) && (iVar3 = bcmp(__s1,psVar10 + qVar9,__n), iVar3 == 0)) {
            return qVar9;
          }
          if (__n - 1 < 0x40) {
            lVar5 = lVar5 - ((long)psVar10[qVar9 + (__n - 1)] << ((byte)(__n - 1) & 0x3f));
          }
          lVar5 = lVar5 * 2;
          lVar2 = qVar9 + -1;
          qVar9 = qVar9 + -1;
        } while (psVar10 <= psVar10 + lVar2);
        uVar4 = 0xffffffffffffffff;
      }
    }
  }
  return uVar4;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    if (haystack.isEmpty()) {
        if (needle.isEmpty() && from == 0)
            return 0;
        return -1;
    }
    const auto ol = needle.size();
    if (ol == 1)
        return QtPrivate::lastIndexOf(haystack, from, needle.front());

    return lastIndexOfHelper(haystack.data(), haystack.size(), needle.data(), ol, from);
}